

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O3

void crnlib::dxt_fast::compress_color_block
               (uint n,color_quad_u8 *block,uint *low16,uint *high16,uint8 *pSelectors,bool refine)

{
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined2 uVar5;
  color_quad_u8 cVar6;
  undefined2 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  undefined1 auVar14 [12];
  unkbyte10 Var15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [14];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  uint *puVar20;
  uint *puVar21;
  bool bVar22;
  uint16 uVar23;
  uint i;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint32 uVar27;
  ulong uVar28;
  size_t sVar29;
  long lVar30;
  uint64 uVar31;
  undefined1 *puVar32;
  undefined8 uVar33;
  uint64 uVar34;
  uint uVar35;
  undefined4 uVar36;
  undefined8 uVar37;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar38;
  ulong uVar39;
  uint uVar40;
  int iVar41;
  color_quad_u8 *pcVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  uchar *puVar47;
  long lVar48;
  ulong uVar49;
  undefined7 in_register_00000089;
  char cVar50;
  uint uVar51;
  size_t __n;
  uint i_3;
  uint uVar52;
  bool bVar53;
  undefined2 uVar107;
  float fVar54;
  undefined1 auVar63 [16];
  float fVar66;
  double dVar69;
  double dVar70;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined2 uVar108;
  double dVar71;
  int iVar85;
  double dVar72;
  undefined1 auVar73 [16];
  undefined1 auVar82 [16];
  undefined1 in_XMM3_Ba;
  undefined1 uVar86;
  undefined1 in_XMM3_Bb;
  undefined1 uVar87;
  undefined1 in_XMM3_Bc;
  undefined1 uVar88;
  undefined1 in_XMM3_Bd;
  undefined1 uVar89;
  undefined1 in_XMM3_Be;
  undefined1 uVar90;
  undefined1 in_XMM3_Bf;
  undefined1 uVar91;
  undefined1 in_XMM3_Bg;
  undefined1 uVar92;
  undefined1 in_XMM3_Bh;
  undefined1 uVar93;
  double dVar94;
  double dVar95;
  undefined1 auVar96 [16];
  byte bVar98;
  double dVar97;
  double dVar99;
  double dVar100;
  int iVar102;
  undefined1 auVar101 [16];
  double dVar103;
  undefined1 auVar104 [16];
  double dVar105;
  undefined1 auVar106 [16];
  int max [3];
  uint ave_color [3];
  uint c;
  vec3F scaled_principle_axis;
  vec3F initial_ofs;
  int min [3];
  vec3F probe_high_color;
  vec3F probe_low_color;
  uint probe_low [17];
  uint probe_high [17];
  byte local_238 [6];
  byte local_232;
  undefined1 local_231;
  undefined1 local_230;
  undefined1 local_22f;
  undefined1 local_22e;
  undefined1 local_22c;
  undefined1 local_22b;
  undefined1 local_22a;
  uint *local_228;
  bool local_21d;
  uint local_21c;
  uint *local_218;
  uchar *local_210;
  float local_204;
  undefined1 *local_200;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_1f8;
  uint local_1ec;
  undefined8 local_1e8;
  long lStack_1e0;
  long local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [16];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1b8 [2];
  uint local_1b0;
  uint local_1ac;
  uint local_1a8 [4];
  undefined8 local_198;
  float local_190;
  size_t local_188;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_180;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_17c;
  undefined8 local_178;
  float local_170;
  dxt1_block local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  uint8 *local_140;
  uint local_134;
  float local_130 [6];
  undefined8 local_118;
  undefined8 uStack_110;
  uint64 local_108;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_100;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_fc;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  float local_d0;
  double local_c8 [10];
  double local_78 [9];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar64 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar65 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar55 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar83 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar84 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar74 [16];
  
  local_228 = low16;
  __n = (size_t)n;
  lVar48 = 0;
  pcVar42 = block;
  do {
    bVar98 = (block->field_0).c[lVar48];
    uVar28 = (ulong)bVar98;
    uVar45 = (uint)bVar98;
    uVar44 = (uint)bVar98;
    if (4 < n * 4) {
      uVar39 = 4;
      uVar46 = uVar28;
      uVar49 = uVar28;
      do {
        bVar98 = (pcVar42->field_0).c[uVar39];
        uVar28 = uVar28 + bVar98;
        uVar44 = (uint)bVar98;
        if ((uint)bVar98 <= (uint)uVar49) {
          uVar49 = (ulong)uVar44;
        }
        uVar45 = (uint)uVar49;
        if (uVar44 < (uint)uVar46) {
          uVar44 = (uint)uVar46;
        }
        uVar39 = uVar39 + 4;
        uVar46 = (ulong)uVar44;
      } while (uVar39 < n * 4);
    }
    local_1a8[lVar48] = (uint)((uVar28 + (n >> 1)) / __n);
    *(uint *)(local_168.m_low_color + lVar48 * 4) = uVar45;
    *(uint *)((long)&local_1e8 + lVar48 * 4) = uVar44;
    lVar48 = lVar48 + 1;
    pcVar42 = (color_quad_u8 *)((long)&pcVar42->field_0 + 1);
  } while (lVar48 != 3);
  local_1d0 = (ulong)n;
  if (((local_168._0_4_ == (uint)local_1e8) && (local_168.m_selectors == local_1e8._4_4_)) &&
     ((int)uStack_160 == (int)lStack_1e0)) {
    memset(pSelectors,2,__n);
    *local_228 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a8[2] * 2] |
                 (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a8[1] * 2] << 5 |
                 (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a8[0] * 2] << 0xb;
    n = (uint)local_1d0;
    uVar51 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a8[2] * 2 + 1] |
             (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a8[1] * 2 + 1] << 5 |
             (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a8[0] * 2 + 1] << 0xb;
    *high16 = uVar51;
  }
  else {
    local_c8[4] = 0.0;
    local_c8[5] = 0.0;
    local_c8[2] = 0.0;
    local_c8[3] = 0.0;
    local_c8[1] = 0.0;
    if (n == 0) {
      local_c8[0] = 0.0;
    }
    else {
      uVar46 = 0;
      uVar28 = CONCAT17(in_XMM3_Bh,
                        CONCAT16(in_XMM3_Bg,
                                 CONCAT15(in_XMM3_Bf,
                                          CONCAT14(in_XMM3_Be,
                                                   CONCAT13(in_XMM3_Bd,
                                                            CONCAT12(in_XMM3_Bc,
                                                                     CONCAT11(in_XMM3_Bb,in_XMM3_Ba)
                                                                    )))))) ^
               CONCAT17(in_XMM3_Bh,
                        CONCAT16(in_XMM3_Bg,
                                 CONCAT15(in_XMM3_Bf,
                                          CONCAT14(in_XMM3_Be,
                                                   CONCAT13(in_XMM3_Bd,
                                                            CONCAT12(in_XMM3_Bc,
                                                                     CONCAT11(in_XMM3_Bb,in_XMM3_Ba)
                                                                    ))))));
      uVar86 = (undefined1)uVar28;
      uVar87 = (undefined1)(uVar28 >> 8);
      uVar88 = (undefined1)(uVar28 >> 0x10);
      uVar89 = (undefined1)(uVar28 >> 0x18);
      uVar90 = (undefined1)(uVar28 >> 0x20);
      uVar91 = (undefined1)(uVar28 >> 0x28);
      uVar92 = (undefined1)(uVar28 >> 0x30);
      uVar93 = (undefined1)(uVar28 >> 0x38);
      dVar71 = 0.0;
      local_c8[3] = 0.0;
      dVar69 = 0.0;
      local_c8[5] = 0.0;
      local_c8[0] = 0.0;
      do {
        dVar94 = (double)(int)(block[uVar46].field_0.field_0.r - local_1a8[0]);
        uVar5 = *(undefined2 *)((long)&block[uVar46].field_0 + 1);
        bVar98 = (byte)((ushort)uVar5 >> 8);
        dVar97 = (double)(int)((CONCAT12(bVar98,uVar5) & 0xff) - local_1a8[1]);
        dVar99 = (double)(int)(bVar98 - local_1a8[2]);
        local_c8[1] = (double)CONCAT17(uVar93,CONCAT16(uVar92,CONCAT15(uVar91,CONCAT14(uVar90,
                                                  CONCAT13(uVar89,CONCAT12(uVar88,CONCAT11(uVar87,
                                                  uVar86))))))) + dVar94 * dVar97;
        uVar86 = SUB81(local_c8[1],0);
        uVar87 = (undefined1)((ulong)local_c8[1] >> 8);
        uVar88 = (undefined1)((ulong)local_c8[1] >> 0x10);
        uVar89 = (undefined1)((ulong)local_c8[1] >> 0x18);
        uVar90 = (undefined1)((ulong)local_c8[1] >> 0x20);
        uVar91 = (undefined1)((ulong)local_c8[1] >> 0x28);
        uVar92 = (undefined1)((ulong)local_c8[1] >> 0x30);
        uVar93 = (undefined1)((ulong)local_c8[1] >> 0x38);
        dVar71 = dVar71 + dVar94 * dVar99;
        local_c8[3] = local_c8[3] + dVar97 * dVar97;
        dVar69 = dVar69 + dVar97 * dVar99;
        local_c8[5] = local_c8[5] + dVar99 * dVar99;
        local_c8[0] = local_c8[0] + dVar94 * dVar94;
        uVar46 = uVar46 + 1;
      } while (__n != uVar46);
      auVar96._8_4_ = SUB84(dVar71,0);
      auVar96._0_8_ = local_c8[1];
      auVar96._12_4_ = (int)((ulong)dVar71 >> 0x20);
      local_c8[2] = auVar96._8_8_;
      auVar8._8_4_ = SUB84(dVar69,0);
      auVar8._0_8_ = local_c8[3];
      auVar8._12_4_ = (int)((ulong)dVar69 >> 0x20);
      local_c8[4] = auVar8._8_8_;
    }
    lVar48 = 0;
    do {
      dVar71 = local_c8[lVar48 + 1];
      local_78[lVar48] = local_c8[lVar48] * 0.003921568859368563;
      local_78[lVar48 + 1] = dVar71 * 0.003921568859368563;
      lVar48 = lVar48 + 2;
    } while (lVar48 != 6);
    dVar94 = (double)((int)lStack_1e0 - (int)uStack_160);
    iVar24 = 4;
    dVar71 = (double)(int)((uint)local_1e8 - local_168._0_4_);
    dVar69 = (double)((int)local_1e8._4_4_ - (int)local_168.m_selectors);
    do {
      dVar97 = dVar94 * local_78[2] + local_78[1] * dVar69 + local_78[0] * dVar71;
      dVar99 = dVar94 * local_78[4] + local_78[1] * dVar71 + local_78[3] * dVar69;
      dVar94 = dVar69 * local_78[4] + dVar71 * local_78[2] + local_78[5] * dVar94;
      iVar24 = iVar24 + -1;
      dVar71 = dVar97;
      dVar69 = dVar99;
    } while (iVar24 != 0);
    dVar71 = ABS(dVar97);
    if (ABS(dVar97) <= ABS(dVar99)) {
      dVar71 = ABS(dVar99);
    }
    if (dVar71 <= ABS(dVar94)) {
      dVar71 = ABS(dVar94);
    }
    uVar86 = 0;
    uVar87 = 0;
    uVar88 = 0;
    uVar89 = 0;
    uVar90 = 0;
    uVar91 = 0;
    uVar92 = 0x10;
    uVar93 = 0x40;
    if (4.0 <= dVar71) {
      dVar71 = 512.0 / dVar71;
      uVar86 = SUB81(dVar71,0);
      uVar87 = (undefined1)((ulong)dVar71 >> 8);
      uVar88 = (undefined1)((ulong)dVar71 >> 0x10);
      uVar89 = (undefined1)((ulong)dVar71 >> 0x18);
      uVar90 = (undefined1)((ulong)dVar71 >> 0x20);
      uVar91 = (undefined1)((ulong)dVar71 >> 0x28);
      uVar92 = (undefined1)((ulong)dVar71 >> 0x30);
      uVar93 = (undefined1)((ulong)dVar71 >> 0x38);
      iVar102 = (int)(dVar97 * dVar71);
      iVar85 = (int)(dVar99 * dVar71);
      iVar24 = (int)(dVar94 * dVar71);
      local_118 = (uchar *)CONCAT44((float)(dVar99 * dVar71),(float)(dVar97 * dVar71));
      local_204 = (float)(dVar94 * dVar71);
    }
    else {
      iVar102 = 0x94;
      iVar85 = 300;
      local_118 = (uchar *)0x4396000043140000;
      iVar24 = 0x3a;
      local_204 = 58.0;
    }
    uStack_110 = 0;
    local_21c = (uint)CONCAT71(in_register_00000089,refine);
    bVar98 = (block->field_0).field_0.r;
    bVar2 = (block->field_0).field_0.g;
    uVar35 = (uint)bVar98;
    bVar3 = (block->field_0).field_0.b;
    uVar44 = (uint)bVar2;
    uVar40 = (uint)bVar3;
    uVar45 = uVar35;
    uVar26 = uVar44;
    if (1 < n) {
      iVar41 = uVar40 * iVar24 + uVar35 * iVar102 + uVar44 * iVar85;
      lVar48 = 0;
      local_1c8[0] = bVar98;
      local_200 = (undefined1 *)CONCAT71(local_200._1_7_,bVar98);
      local_1f8 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                  CONCAT71(local_1f8._1_7_,bVar2);
      local_210 = (uchar *)CONCAT71(local_210._1_7_,bVar3);
      uVar44 = (uint)bVar2;
      iVar43 = iVar41;
      do {
        bVar98 = block[lVar48 + 1].field_0.field_0.r;
        bVar2 = block[lVar48 + 1].field_0.field_0.g;
        bVar4 = block[lVar48 + 1].field_0.field_0.b;
        iVar25 = (uint)bVar4 * iVar24 + (uint)bVar2 * iVar85 + (uint)bVar98 * iVar102;
        if (iVar25 < iVar43) {
          local_210 = (uchar *)CONCAT71(local_210._1_7_,bVar4);
          local_1f8 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                      CONCAT71(local_1f8._1_7_,bVar2);
          local_200 = (undefined1 *)CONCAT71(local_200._1_7_,bVar98);
          iVar43 = iVar25;
        }
        if (iVar41 < iVar25) {
          local_1c8[0] = bVar98;
          iVar41 = iVar25;
          uVar44 = (uint)bVar2;
          bVar3 = bVar4;
        }
        lVar48 = lVar48 + 1;
      } while (__n - 1 != lVar48);
      uVar35 = (uint)local_1c8[0];
      uVar40 = (uint)(byte)local_210;
      uVar45 = (uint)(byte)local_200;
      uVar26 = (uint)(byte)local_1f8;
    }
    *low16 = (((uint)bVar3 * 0x1f + 0x80 >> 8) + (uint)bVar3 * 0x1f + 0x80 >> 8) +
             (uVar44 * 0x3f + (uVar44 * 0x3f + 0x80 >> 8) + 0x80 >> 3 & 0x1fe0) +
             ((uVar35 * 0x1f + 0x80 >> 8) + uVar35 * 0x1f + 0x80 & 0x7f00) * 8;
    uVar51 = ((uVar40 * 0x1f + 0x80 >> 8) + uVar40 * 0x1f + 0x80 >> 8) +
             ((uVar26 * 0x3f + 0x80 >> 8) + uVar26 * 0x3f + 0x80 >> 3 & 0x1fe0) +
             (uVar45 * 0x1f + (uVar45 * 0x1f + 0x80 >> 8) + 0x80 & 0x7f00) * 8;
    *high16 = uVar51;
    local_218 = high16;
    local_188 = __n;
    bVar22 = determine_selectors(n,block,*low16,uVar51,pSelectors);
    __n = local_188;
    if (bVar22) {
      if (n == 0) {
        dVar99 = 0.0;
        dVar70 = 0.0;
        dVar97 = 0.0;
        dVar95 = 0.0;
        dVar72 = 0.0;
        uVar28 = CONCAT17(uVar93,CONCAT16(uVar92,CONCAT15(uVar91,CONCAT14(uVar90,CONCAT13(uVar89,
                                                  CONCAT12(uVar88,CONCAT11(uVar87,uVar86))))))) ^
                 CONCAT17(uVar93,CONCAT16(uVar92,CONCAT15(uVar91,CONCAT14(uVar90,CONCAT13(uVar89,
                                                  CONCAT12(uVar88,CONCAT11(uVar87,uVar86)))))));
        uVar86 = (undefined1)uVar28;
        uVar87 = (undefined1)(uVar28 >> 8);
        uVar88 = (undefined1)(uVar28 >> 0x10);
        uVar89 = (undefined1)(uVar28 >> 0x18);
        uVar90 = (undefined1)(uVar28 >> 0x20);
        uVar91 = (undefined1)(uVar28 >> 0x28);
        uVar92 = (undefined1)(uVar28 >> 0x30);
        uVar93 = (undefined1)(uVar28 >> 0x38);
        dVar71 = 0.0;
        dVar69 = 0.0;
        dVar94 = 0.0;
      }
      else {
        dVar72 = 0.0;
        sVar29 = 0;
        dVar95 = 0.0;
        dVar97 = 0.0;
        dVar99 = 0.0;
        dVar70 = 0.0;
        dVar69 = 0.0;
        dVar94 = 0.0;
        uVar28 = CONCAT17(uVar93,CONCAT16(uVar92,CONCAT15(uVar91,CONCAT14(uVar90,CONCAT13(uVar89,
                                                  CONCAT12(uVar88,CONCAT11(uVar87,uVar86))))))) ^
                 CONCAT17(uVar93,CONCAT16(uVar92,CONCAT15(uVar91,CONCAT14(uVar90,CONCAT13(uVar89,
                                                  CONCAT12(uVar88,CONCAT11(uVar87,uVar86)))))));
        uVar86 = (undefined1)uVar28;
        uVar87 = (undefined1)(uVar28 >> 8);
        uVar88 = (undefined1)(uVar28 >> 0x10);
        uVar89 = (undefined1)(uVar28 >> 0x18);
        uVar90 = (undefined1)(uVar28 >> 0x20);
        uVar91 = (undefined1)(uVar28 >> 0x28);
        uVar92 = (undefined1)(uVar28 >> 0x30);
        uVar93 = (undefined1)(uVar28 >> 0x38);
        dVar71 = 0.0;
        do {
          cVar6.field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
               *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                &block[sVar29].field_0.field_0;
          dVar103 = (double)block[sVar29].field_0.field_0.b;
          bVar98 = pSelectors[sVar29];
          dVar72 = dVar72 + (double)dxt1_endpoint_optimizer::refine_solution::prods_1[bVar98];
          dVar69 = dVar69 + (double)dxt1_endpoint_optimizer::refine_solution::prods_2[bVar98];
          dVar94 = dVar94 + (double)dxt1_endpoint_optimizer::refine_solution::prods_0[bVar98];
          dVar105 = (double)dxt1_endpoint_optimizer::refine_solution::w1Tab[bVar98];
          uVar28 = (ulong)cVar6.field_0._0_2_ & 0xffffffffffff00ff;
          auVar9._8_4_ = 0;
          auVar9._0_8_ = uVar28;
          auVar9[0xc] = cVar6.field_0._3_1_;
          auVar10[8] = cVar6.field_0._2_1_;
          auVar10._0_8_ = uVar28;
          auVar10[9] = 0;
          auVar10._10_3_ = auVar9._10_3_;
          auVar12._5_8_ = 0;
          auVar12._0_5_ = auVar10._8_5_;
          auVar11[4] = cVar6.field_0._1_1_;
          auVar11._0_4_ = (int)uVar28;
          auVar11[5] = 0;
          auVar11._6_7_ = SUB137(auVar12 << 0x40,6);
          dVar100 = (double)(int)uVar28;
          dVar97 = dVar97 + dVar103;
          dVar99 = dVar99 + dVar105 * dVar100;
          dVar70 = dVar70 + dVar105 * (double)auVar11._4_4_;
          dVar95 = dVar95 + dVar103 * dVar105;
          dVar100 = (double)CONCAT17(uVar93,CONCAT16(uVar92,CONCAT15(uVar91,CONCAT14(uVar90,CONCAT13
                                                  (uVar89,CONCAT12(uVar88,CONCAT11(uVar87,uVar86))))
                                                  ))) + dVar100;
          uVar86 = SUB81(dVar100,0);
          uVar87 = (undefined1)((ulong)dVar100 >> 8);
          uVar88 = (undefined1)((ulong)dVar100 >> 0x10);
          uVar89 = (undefined1)((ulong)dVar100 >> 0x18);
          uVar90 = (undefined1)((ulong)dVar100 >> 0x20);
          uVar91 = (undefined1)((ulong)dVar100 >> 0x28);
          uVar92 = (undefined1)((ulong)dVar100 >> 0x30);
          uVar93 = (undefined1)((ulong)dVar100 >> 0x38);
          dVar71 = dVar71 + (double)auVar11._4_4_;
          sVar29 = sVar29 + 1;
        } while (local_188 != sVar29);
        dVar97 = dVar97 * 3.0;
        dVar100 = dVar100 * 3.0;
        uVar86 = SUB81(dVar100,0);
        uVar87 = (undefined1)((ulong)dVar100 >> 8);
        uVar88 = (undefined1)((ulong)dVar100 >> 0x10);
        uVar89 = (undefined1)((ulong)dVar100 >> 0x18);
        uVar90 = (undefined1)((ulong)dVar100 >> 0x20);
        uVar91 = (undefined1)((ulong)dVar100 >> 0x28);
        uVar92 = (undefined1)((ulong)dVar100 >> 0x30);
        uVar93 = (undefined1)((ulong)dVar100 >> 0x38);
        dVar71 = dVar71 * 3.0;
      }
      cVar50 = (char)local_21c;
      uVar51 = *high16;
      if ((((dVar72 != 0.0) || (NAN(dVar72))) && ((dVar69 != 0.0 || (NAN(dVar69))))) &&
         (dVar100 = dVar72 * dVar69 - dVar94 * dVar94, 1.249999968422344e-05 <= ABS(dVar100))) {
        dVar103 = (double)CONCAT17(uVar93,CONCAT16(uVar92,CONCAT15(uVar91,CONCAT14(uVar90,CONCAT13(
                                                  uVar89,CONCAT12(uVar88,CONCAT11(uVar87,uVar86)))))
                                                  )) - dVar99;
        dVar100 = 0.364705890417099 / dVar100;
        iVar24 = (int)((dVar72 * dVar99 - dVar103 * dVar94) * dVar100 + 0.5);
        iVar102 = (int)((dVar72 * dVar70 - (dVar71 - dVar70) * dVar94) *
                        dVar100 * 2.0322580337524414 + 0.5);
        uVar52 = *local_228;
        auVar96 = ZEXT816(0x3f0000001f);
        auVar104._0_8_ = CONCAT44(-(uint)(iVar102 < auVar96._4_4_),-(uint)(iVar24 < auVar96._0_4_));
        auVar104._8_8_ = 0;
        auVar101._8_8_ = 0;
        auVar101._0_8_ = CONCAT44(iVar102,iVar24) & auVar104._0_8_;
        auVar101 = ~auVar104 & auVar96 | auVar101;
        auVar106._0_4_ = -(uint)(0 < auVar101._0_4_);
        auVar106._4_4_ = -(uint)(0 < auVar101._4_4_);
        auVar106._8_4_ = -(uint)(0 < auVar101._8_4_);
        auVar106._12_4_ = -(uint)(0 < auVar101._12_4_);
        uVar44 = (uint)((dVar72 * dVar95 - (dVar97 - dVar95) * dVar94) * dVar100 + 0.5);
        if (0x1e < (int)uVar44) {
          uVar44 = 0x1f;
        }
        if ((int)uVar44 < 1) {
          uVar44 = 0;
        }
        *local_228 = SUB164(auVar106 & auVar101,4) << 5 |
                     SUB164(auVar106 & auVar101,0) << 0xb | uVar44;
        iVar24 = (int)((dVar69 * dVar103 - dVar99 * dVar94) * dVar100 + 0.5);
        iVar102 = (int)((dVar69 * (dVar71 - dVar70) - dVar70 * dVar94) *
                        dVar100 * 2.0322580337524414 + 0.5);
        auVar73._0_8_ = CONCAT44(-(uint)(iVar102 < auVar96._4_4_),-(uint)(iVar24 < auVar96._0_4_));
        auVar73._8_8_ = 0;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = CONCAT44(iVar102,iVar24) & auVar73._0_8_;
        auVar67 = ~auVar73 & auVar96 | auVar67;
        auVar68._0_4_ = -(uint)(0 < auVar67._0_4_);
        auVar68._4_4_ = -(uint)(0 < auVar67._4_4_);
        auVar68._8_4_ = -(uint)(0 < auVar67._8_4_);
        auVar68._12_4_ = -(uint)(0 < auVar67._12_4_);
        uVar45 = (uint)(((dVar97 - dVar95) * dVar69 - dVar94 * dVar95) * dVar100 + 0.5);
        uVar44 = 0x1f;
        if ((int)uVar45 < 0x1f) {
          uVar44 = uVar45;
        }
        if ((int)uVar44 < 1) {
          uVar44 = 0;
        }
        uVar44 = SUB164(auVar68 & auVar67,4) << 5 | SUB164(auVar68 & auVar67,0) << 0xb | uVar44;
        *high16 = uVar44;
        if ((uVar51 != uVar44) || (uVar52 != *local_228)) {
          determine_selectors(n,block,*local_228,uVar44,pSelectors);
          uVar51 = *high16;
        }
      }
      if (cVar50 != '\0') {
        uVar52 = *local_228;
        local_108 = determine_error(n,block,uVar52,uVar51,0xffffffffffffffff);
        if (local_108 != 0) {
          uVar90 = 0;
          uVar91 = 0;
          uVar92 = 0;
          uVar93 = 0;
          fVar66 = 1.0 / SQRT(local_204 * local_204 +
                              local_118._4_4_ * local_118._4_4_ +
                              (float)local_118 * (float)local_118);
          local_d0 = local_204 * fVar66;
          uVar86 = SUB41(local_d0,0);
          uVar87 = (undefined1)((uint)local_d0 >> 8);
          uVar88 = (undefined1)((uint)local_d0 >> 0x10);
          uVar89 = (undefined1)((uint)local_d0 >> 0x18);
          local_d8 = CONCAT44(fVar66 * local_118._4_4_,fVar66 * (float)local_118);
          lVar48 = 0;
          do {
            *(float *)((long)&local_198 + lVar48 * 4) =
                 *(float *)((long)&local_d8 + lVar48 * 4) * 0.027063293;
            lVar48 = lVar48 + 1;
          } while (lVar48 != 3);
          local_198 = CONCAT44((float)((ulong)local_198 >> 0x20) * 63.0,(float)local_198 * 31.0);
          local_190 = local_190 * 31.0;
          lVar48 = 0;
          do {
            *(float *)((long)&local_178 + lVar48 * 4) =
                 *(float *)((long)&local_198 + lVar48 * 4) * -8.0;
            lVar48 = lVar48 + 1;
          } while (lVar48 != 3);
          local_178 = CONCAT44((float)((ulong)local_178 >> 0x20) + 0.5,(float)local_178 + 0.5);
          local_170 = local_170 + 0.5;
          local_1ec = 0;
          local_140 = pSelectors;
          do {
            dxt1_block::unpack_color(&local_168,(uint16)uVar52,false,0xff);
            uVar26 = (uint)local_168.m_high_color[0];
            local_1c8 = ZEXT416((uint)local_168._0_4_);
            dxt1_block::unpack_color(&local_168,(uint16)*high16,false,0xff);
            uVar44 = CONCAT13(uVar89,CONCAT12(uVar88,CONCAT11(uVar87,uVar86))) ^
                     CONCAT13(uVar89,CONCAT12(uVar88,CONCAT11(uVar87,uVar86)));
            uVar86 = (undefined1)uVar44;
            uVar87 = (undefined1)(uVar44 >> 8);
            uVar88 = (undefined1)(uVar44 >> 0x10);
            uVar89 = (undefined1)(uVar44 >> 0x18);
            uVar45 = CONCAT13(uVar93,CONCAT12(uVar92,CONCAT11(uVar91,uVar90))) ^
                     CONCAT13(uVar93,CONCAT12(uVar92,CONCAT11(uVar91,uVar90)));
            uVar90 = (undefined1)uVar45;
            uVar91 = (undefined1)(uVar45 >> 8);
            uVar92 = (undefined1)(uVar45 >> 0x10);
            uVar93 = (undefined1)(uVar45 >> 0x18);
            auVar62._0_14_ = local_1c8._0_14_;
            auVar62[0xe] = local_1c8[7];
            auVar62[0xf] = uVar93;
            auVar61._14_2_ = auVar62._14_2_;
            auVar61._0_13_ = local_1c8._0_13_;
            auVar61[0xd] = uVar92;
            auVar60._13_3_ = auVar61._13_3_;
            auVar60._0_12_ = local_1c8._0_12_;
            auVar60[0xc] = local_1c8[6];
            auVar59._12_4_ = auVar60._12_4_;
            auVar59._0_11_ = local_1c8._0_11_;
            auVar59[0xb] = uVar91;
            auVar58._11_5_ = auVar59._11_5_;
            auVar58._0_10_ = local_1c8._0_10_;
            auVar58[10] = local_1c8[5];
            auVar57._10_6_ = auVar58._10_6_;
            auVar57._0_9_ = local_1c8._0_9_;
            auVar57[9] = uVar90;
            auVar56._9_7_ = auVar57._9_7_;
            auVar56._0_8_ = local_1c8._0_8_;
            auVar56[8] = local_1c8[4];
            Var15 = CONCAT91(CONCAT81(auVar56._8_8_,uVar89),local_1c8[3]);
            auVar14._2_10_ = Var15;
            auVar14[1] = uVar88;
            auVar14[0] = local_1c8[2];
            auVar13._2_12_ = auVar14;
            auVar13[1] = uVar87;
            auVar13[0] = local_1c8[1];
            uVar107 = CONCAT11(uVar86,local_1c8[0]);
            auVar55._2_14_ = auVar13;
            uVar7 = (undefined2)(uVar45 >> 0x10);
            auVar65._0_12_ = auVar55._0_12_;
            auVar65._12_2_ = (short)Var15;
            auVar65._14_2_ = uVar7;
            auVar64._12_4_ = auVar65._12_4_;
            auVar64._0_10_ = auVar55._0_10_;
            auVar64._10_2_ = (short)uVar45;
            auVar63._10_6_ = auVar64._10_6_;
            auVar63._0_8_ = auVar55._0_8_;
            auVar63._8_2_ = auVar14._0_2_;
            uVar5 = (undefined2)(uVar44 >> 0x10);
            auVar16._4_8_ = auVar63._8_8_;
            auVar16._2_2_ = uVar5;
            auVar16._0_2_ = auVar13._0_2_;
            local_e8 = CONCAT44((float)auVar16._0_4_,(float)CONCAT22((short)uVar44,uVar107));
            local_e0 = (float)uVar26;
            auVar81._0_15_ = ZEXT415(0);
            auVar81[0xf] = uVar93;
            auVar80._14_2_ = auVar81._14_2_;
            auVar80._0_13_ = ZEXT413(0);
            auVar80[0xd] = uVar92;
            auVar79._13_3_ = auVar80._13_3_;
            auVar79._0_13_ = ZEXT413(0);
            auVar78._12_4_ = auVar79._12_4_;
            auVar78._0_11_ = ZEXT411(0);
            auVar78[0xb] = uVar91;
            auVar77._11_5_ = auVar78._11_5_;
            auVar77._0_11_ = ZEXT411(0);
            auVar76._10_6_ = auVar77._10_6_;
            auVar76._0_9_ = (unkuint9)0;
            auVar76[9] = uVar90;
            auVar75._9_7_ = auVar76._9_7_;
            auVar75._0_9_ = (unkuint9)0;
            Var15 = CONCAT91(CONCAT81(auVar75._8_8_,uVar89),local_168.m_high_color[1]);
            auVar19._2_10_ = Var15;
            auVar19[1] = uVar88;
            auVar19[0] = local_168.m_high_color[0];
            auVar17._2_12_ = auVar19;
            auVar17[1] = uVar87;
            auVar17[0] = local_168.m_low_color[1];
            uVar108 = CONCAT11(uVar86,local_168.m_low_color[0]);
            auVar74._2_14_ = auVar17;
            auVar84._0_12_ = auVar74._0_12_;
            auVar84._12_2_ = (short)Var15;
            auVar84._14_2_ = uVar7;
            auVar83._12_4_ = auVar84._12_4_;
            auVar83._0_10_ = auVar74._0_10_;
            auVar83._10_2_ = (short)uVar45;
            auVar82._10_6_ = auVar83._10_6_;
            auVar82._0_8_ = auVar74._0_8_;
            auVar82._8_2_ = auVar19._0_2_;
            auVar18._4_8_ = auVar82._8_8_;
            auVar18._2_2_ = uVar5;
            auVar18._0_2_ = auVar17._0_2_;
            local_f8 = CONCAT44((float)auVar18._0_4_,(float)CONCAT22((short)uVar44,uVar108));
            local_f0 = (float)local_168.m_high_color[0];
            lVar48 = 0;
            do {
              local_130[lVar48 + 3] =
                   *(float *)((long)&local_e8 + lVar48 * 4) +
                   *(float *)((long)&local_178 + lVar48 * 4);
              lVar48 = lVar48 + 1;
            } while (lVar48 != 3);
            lVar48 = 0;
            do {
              fVar66 = local_130[4];
              fVar54 = floorf(local_130[3]);
              iVar24 = (int)fVar54;
              if (0x1e < iVar24) {
                iVar24 = 0x1f;
              }
              if (iVar24 < 1) {
                iVar24 = 0;
              }
              fVar66 = floorf(fVar66);
              iVar102 = (int)fVar66;
              if (0x3e < iVar102) {
                iVar102 = 0x3f;
              }
              if (iVar102 < 1) {
                iVar102 = 0;
              }
              fVar66 = floorf(local_130[5]);
              uVar44 = (uint)fVar66;
              if (0x1e < (int)uVar44) {
                uVar44 = 0x1f;
              }
              if ((int)uVar44 < 1) {
                uVar44 = 0;
              }
              *(uint *)((long)local_c8 + lVar48 * 4) = iVar24 << 0xb | iVar102 << 5 | uVar44;
              lVar30 = 0;
              do {
                local_130[lVar30 + 3] =
                     *(float *)((long)&local_198 + lVar30 * 4) + local_130[lVar30 + 3];
                lVar30 = lVar30 + 1;
              } while (lVar30 != 3);
              lVar48 = lVar48 + 1;
            } while (lVar48 != 0x11);
            lVar48 = 0;
            do {
              local_130[lVar48] =
                   *(float *)((long)&local_f8 + lVar48 * 4) +
                   *(float *)((long)&local_178 + lVar48 * 4);
              lVar48 = lVar48 + 1;
            } while (lVar48 != 3);
            lVar48 = 0;
            do {
              fVar66 = local_130[1];
              fVar54 = floorf(local_130[0]);
              iVar24 = (int)fVar54;
              if (0x1e < iVar24) {
                iVar24 = 0x1f;
              }
              if (iVar24 < 1) {
                iVar24 = 0;
              }
              fVar66 = floorf(fVar66);
              iVar102 = (int)fVar66;
              if (0x3e < iVar102) {
                iVar102 = 0x3f;
              }
              if (iVar102 < 1) {
                iVar102 = 0;
              }
              fVar66 = floorf(local_130[2]);
              uVar44 = (uint)fVar66;
              if (0x1e < (int)uVar44) {
                uVar44 = 0x1f;
              }
              if ((int)uVar44 < 1) {
                uVar44 = 0;
              }
              *(uint *)((long)local_78 + lVar48 * 4) = iVar24 << 0xb | iVar102 << 5 | uVar44;
              lVar30 = 0;
              do {
                local_130[lVar30] = *(float *)((long)&local_198 + lVar30 * 4) + local_130[lVar30];
                lVar30 = lVar30 + 1;
              } while (lVar30 != 3);
              lVar48 = lVar48 + 1;
            } while (lVar48 != 0x11);
            local_158 = 0;
            uStack_150 = 0;
            local_168.m_low_color[0] = '\0';
            local_168.m_low_color[1] = '\0';
            local_168.m_high_color[0] = '\0';
            local_168.m_high_color[1] = '\0';
            local_168.m_selectors[0] = '\0';
            local_168.m_selectors[1] = '\0';
            local_168.m_selectors[2] = '\0';
            local_168.m_selectors[3] = '\0';
            uStack_160 = 0;
            local_1c8._0_4_ = *local_218;
            local_210 = (uchar *)CONCAT44(local_210._4_4_,*local_228);
            local_1a8[3] = *local_218 << 0x10 | *local_228;
            local_1a8[3] = fast_hash(local_1a8 + 3,4);
            *(long *)(local_168.m_low_color + (local_1a8[3] >> 3 & 0x18)) =
                 1L << ((byte)local_1a8[3] & 0x3f);
            puVar32 = (undefined1 *)0x0;
            do {
              local_200 = puVar32;
              uVar44 = *(uint *)((long)local_c8 + (long)puVar32 * 4);
              lVar48 = 0;
              do {
                uVar45 = *(uint *)((long)local_78 + lVar48 * 4);
                uVar26 = uVar45;
                if (uVar44 >= uVar45 && uVar44 != uVar45) {
                  uVar26 = uVar44;
                }
                if (uVar44 < uVar45) {
                  uVar45 = uVar44;
                }
                local_1e8._0_4_ = uVar45 << 0x10 | uVar26;
                uVar27 = fast_hash(&local_1e8,4);
                local_1e8 = CONCAT44(local_1e8._4_4_,uVar27);
                uVar35 = uVar27 >> 6 & 3;
                if (((ulong)(&local_168)[uVar35] >> ((ulong)uVar27 & 0x3f) & 1) == 0) {
                  (&local_168)[uVar35] =
                       (dxt1_block)(1L << ((byte)uVar27 & 0x3f) | (ulong)(&local_168)[uVar35]);
                  uVar34 = local_108;
                  local_1f8 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                              CONCAT44(local_1f8._4_4_,uVar45);
                  uVar31 = determine_error((uint)local_1d0,block,uVar26,uVar45,local_108);
                  bVar22 = uVar31 < uVar34;
                  uVar45 = (uint)local_210;
                  if (bVar22) {
                    uVar45 = uVar26;
                  }
                  local_210 = (uchar *)CONCAT44(local_210._4_4_,uVar45);
                  uVar36 = local_1c8._0_4_;
                  if (bVar22) {
                    uVar36 = local_1f8._0_4_;
                  }
                  local_1c8._0_4_ = uVar36;
                  if (bVar22) {
                    uVar34 = uVar31;
                  }
                  local_108 = uVar34;
                }
                uVar28 = local_1d0;
                lVar48 = lVar48 + 1;
              } while (lVar48 != 0x11);
              puVar32 = local_200 + 1;
            } while (puVar32 != (undefined1 *)0x11);
            uVar46 = (ulong)(uint)local_1c8._0_4_;
            local_21d = *local_218 != local_1c8._0_4_ || *local_228 != (uint)local_210;
            if (*local_218 != local_1c8._0_4_ || *local_228 != (uint)local_210) {
              *local_228 = (uint)local_210;
              *local_218 = local_1c8._0_4_;
              determine_selectors((uint)local_1d0,block,*local_228,local_1c8._0_4_,pSelectors);
            }
            uVar37 = CONCAT71((int7)(uVar46 >> 8),1);
            uVar33 = 0;
            do {
              puVar21 = local_218;
              local_204 = (float)uVar37;
              local_134 = (uint)uVar33;
              uVar44 = *local_228;
              uVar45 = *local_218;
              local_238[0] = ryg_dxt::Expand5[uVar44 >> 0xb & 0x1f];
              local_238[1] = ryg_dxt::Expand6[uVar44 >> 5 & 0x3f];
              local_238[2] = ryg_dxt::Expand5[uVar44 & 0x1f];
              local_238[4] = ryg_dxt::Expand5[uVar45 >> 0xb & 0x1f];
              local_238[5] = ryg_dxt::Expand6[uVar45 >> 5 & 0x3f];
              local_232 = ryg_dxt::Expand5[uVar45 & 0x1f];
              local_238[3] = 0;
              local_231 = 0;
              local_230 = (char)(((uint)local_238[4] + (uint)local_238[0] * 2) / 3);
              local_22f = (char)(((uint)local_238[5] + (uint)local_238[1] * 2) / 3);
              local_22e = (char)(((uint)local_232 + (uint)local_238[2] * 2) / 3);
              local_22c = (char)(((uint)local_238[0] + (uint)local_238[4] * 2) / 3);
              local_22b = (char)(((uint)local_238[1] + (uint)local_238[5] * 2) / 3);
              local_22a = (char)(((uint)local_238[2] + (uint)local_232 * 2) / 3);
              local_1e8 = 0;
              lStack_1e0 = 0;
              local_1d8 = 0;
              if ((int)uVar28 == 0) {
                local_1e8 = 0;
              }
              else {
                uVar46 = 0;
                local_1d8 = 0;
                lStack_1e0 = 0;
                local_1e8 = 0;
                do {
                  uVar49 = (ulong)pSelectors[uVar46];
                  iVar24 = (uint)block[uVar46].field_0.field_0.r - (uint)local_238[uVar49 * 4];
                  local_1e8 = local_1e8 + (ulong)(uint)(iVar24 * iVar24);
                  iVar24 = (uint)block[uVar46].field_0.field_0.g - (uint)local_238[uVar49 * 4 + 1];
                  lStack_1e0 = lStack_1e0 + (ulong)(uint)(iVar24 * iVar24);
                  iVar24 = (uint)block[uVar46].field_0.field_0.b - (uint)local_238[uVar49 * 4 + 2];
                  local_1d8 = local_1d8 + (ulong)(uint)(iVar24 * iVar24);
                  uVar46 = uVar46 + 1;
                } while (__n != uVar46);
              }
              dxt1_block::unpack_color
                        ((dxt1_block *)&local_1b8[0].field_0,(uint16)uVar44,false,0xff);
              local_180 = local_1b8[0];
              dxt1_block::unpack_color
                        ((dxt1_block *)&local_1b8[0].field_0,(uint16)*puVar21,false,0xff);
              local_17c = local_1b8[0];
              dxt1_block::unpack_color
                        ((dxt1_block *)&local_1b8[0].field_0,(uint16)*local_228,true,0xff);
              local_100 = local_1b8[0];
              dxt1_block::unpack_color
                        ((dxt1_block *)&local_1b8[0].field_0,(uint16)*puVar21,true,0xff);
              lVar48 = 0;
              local_fc = local_1b8[0];
              uVar33 = 0;
              bVar22 = false;
              pcVar42 = block;
              do {
                if ((&local_1e8)[lVar48] != 0) {
                  local_200 = ryg_dxt::Expand5;
                  if (lVar48 == 1) {
                    local_200 = ryg_dxt::Expand6;
                  }
                  local_118 = local_100.c + lVar48;
                  puVar47 = local_180.c + lVar48;
                  local_21c = (uint)CONCAT71((int7)((ulong)(local_100.c + lVar48) >> 8),1);
                  local_1f8 = local_1b8;
                  lVar30 = 0;
                  local_1c8._0_8_ = lVar48;
                  local_210 = puVar47;
                  do {
                    uVar46 = lVar30 * 4 ^ 4;
                    *(uint *)((long)local_1b8 + uVar46) = (uint)local_118[uVar46];
                    iVar24 = -1;
                    do {
                      uVar44 = (uint)puVar47[lVar30 * 4] + iVar24;
                      if ((-1 < (int)uVar44) && ((int)uVar44 <= (int)(&DAT_001b79d0)[lVar48])) {
                        bVar98 = local_200[uVar44];
                        aVar38.m_u32._1_3_ = 0;
                        aVar38.field_0.r = bVar98;
                        *local_1f8 = aVar38;
                        local_1b0 = (local_1b8[1].m_u32 + local_1b8[0].m_u32 * 2) / 3;
                        local_1ac = (local_1b8[0].m_u32 + local_1b8[1].m_u32 * 2) / 3;
                        puVar1 = &local_1e8 + lVar48;
                        if ((int)uVar28 == 0) {
                          uVar46 = 0;
                        }
                        else {
                          uVar46 = 0;
                          uVar49 = 1;
                          do {
                            iVar102 = local_1b8[pSelectors[uVar49 - 1]].m_u32 -
                                      (uint)pcVar42[uVar49 - 1].field_0.field_0.r;
                            uVar46 = (uint)(iVar102 * iVar102) + uVar46;
                            if (*puVar1 <= uVar46) break;
                            bVar53 = uVar49 < __n;
                            uVar49 = uVar49 + 1;
                          } while (bVar53);
                        }
                        puVar47 = local_210;
                        lVar48 = local_1c8._0_8_;
                        if (uVar46 < *puVar1) {
                          local_210[lVar30 * 4] = (uchar)uVar44;
                          local_118[lVar30 * 4] = bVar98;
                          if ((local_21c & 1) == 0) {
                            uVar23 = dxt1_block::pack_color
                                               ((color_quad_u8 *)&local_17c.field_0,false,0x7f);
                            uVar44 = (uint)uVar23;
                            *local_218 = uVar44;
                            uVar51 = *local_228;
                          }
                          else {
                            uVar23 = dxt1_block::pack_color
                                               ((color_quad_u8 *)&local_180.field_0,false,0x7f);
                            uVar51 = (uint)uVar23;
                            *local_228 = (uint)uVar23;
                            uVar44 = *local_218;
                          }
                          uVar28 = local_1d0;
                          puVar21 = local_218;
                          puVar20 = local_228;
                          uVar52 = (uint)local_1d0;
                          determine_selectors(uVar52,block,uVar51,uVar44,local_140);
                          uVar44 = *puVar20;
                          uVar45 = *puVar21;
                          local_238[0] = ryg_dxt::Expand5[uVar44 >> 0xb & 0x1f];
                          local_238[1] = ryg_dxt::Expand6[uVar44 >> 5 & 0x3f];
                          local_238[2] = ryg_dxt::Expand5[uVar44 & 0x1f];
                          local_238[4] = ryg_dxt::Expand5[uVar45 >> 0xb & 0x1f];
                          local_238[5] = ryg_dxt::Expand6[uVar45 >> 5 & 0x3f];
                          local_232 = ryg_dxt::Expand5[uVar45 & 0x1f];
                          local_230 = (char)(((uint)local_238[4] + (uint)local_238[0] * 2) / 3);
                          local_22f = (char)(((uint)local_238[5] + (uint)local_238[1] * 2) / 3);
                          local_22e = (char)(((uint)local_232 + (uint)local_238[2] * 2) / 3);
                          local_22c = (char)(((uint)local_238[0] + (uint)local_238[4] * 2) / 3);
                          local_22b = (char)(((uint)local_238[1] + (uint)local_238[5] * 2) / 3);
                          local_22a = (char)(((uint)local_238[2] + (uint)local_232 * 2) / 3);
                          local_1e8 = 0;
                          lStack_1e0 = 0;
                          local_1d8 = 0;
                          if (uVar52 == 0) {
                            local_1e8 = 0;
                          }
                          else {
                            uVar46 = 0;
                            local_1d8 = 0;
                            lStack_1e0 = 0;
                            local_1e8 = 0;
                            do {
                              uVar49 = (ulong)local_140[uVar46];
                              iVar102 = (uint)block[uVar46].field_0.field_0.r -
                                        (uint)local_238[uVar49 * 4];
                              local_1e8 = local_1e8 + (ulong)(uint)(iVar102 * iVar102);
                              iVar102 = (uint)block[uVar46].field_0.field_0.g -
                                        (uint)local_238[uVar49 * 4 + 1];
                              lStack_1e0 = lStack_1e0 + (ulong)(uint)(iVar102 * iVar102);
                              iVar102 = (uint)block[uVar46].field_0.field_0.b -
                                        (uint)local_238[uVar49 * 4 + 2];
                              local_1d8 = local_1d8 + (ulong)(uint)(iVar102 * iVar102);
                              uVar46 = uVar46 + 1;
                            } while (local_188 != uVar46);
                          }
                          uVar33 = CONCAT71((int7)((ulong)local_1e8 >> 8),1);
                          bVar22 = true;
                          pSelectors = local_140;
                          puVar47 = local_210;
                          lVar48 = local_1c8._0_8_;
                          __n = local_188;
                        }
                      }
                      bVar53 = iVar24 < 0;
                      iVar24 = iVar24 + 2;
                    } while (bVar53);
                    lVar30 = 1;
                    local_1f8 = local_1b8 + 1;
                    uVar44 = local_21c & 1;
                    local_21c = 0;
                  } while (uVar44 != 0);
                }
                high16 = local_218;
                n = (uint)uVar28;
                lVar48 = lVar48 + 1;
                pcVar42 = (color_quad_u8 *)((long)&pcVar42->field_0 + 1);
              } while (lVar48 != 3);
              if (!bVar22) {
                if ((local_134 & 1) == 0) {
                  if ((local_21d & local_1ec < 3) == 0) {
                    uVar51 = *local_218;
                    goto LAB_0017dbe8;
                  }
                  uVar52 = *local_228;
                  goto LAB_0017dbc7;
                }
                break;
              }
              uVar33 = CONCAT71((int7)((ulong)uVar33 >> 8),1);
              uVar37 = 0;
            } while (((uint)local_204 & 1) != 0);
            uVar52 = *local_228;
            uVar51 = *local_218;
            uVar34 = determine_error(n,block,uVar52,uVar51,0xffffffffffffffff);
            if ((uVar34 == 0) || (2 < local_1ec)) break;
LAB_0017dbc7:
            local_1ec = local_1ec + 1;
          } while( true );
        }
      }
    }
    else {
      memset(pSelectors,2,local_188);
      *low16 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a8[2] * 2] |
               (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a8[1] * 2] << 5 |
               (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a8[0] * 2] << 0xb;
      n = (uint)local_1d0;
      uVar51 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a8[2] * 2 + 1] |
               (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a8[1] * 2 + 1] << 5 |
               (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a8[0] * 2 + 1] << 0xb;
      *high16 = uVar51;
      local_228 = low16;
    }
  }
LAB_0017dbe8:
  uVar44 = *local_228;
  if (uVar44 < uVar51) {
    *local_228 = uVar51;
    *high16 = uVar44;
    if (n != 0) {
      uVar28 = 0;
      do {
        pSelectors[uVar28] = pSelectors[uVar28] ^ 1;
        uVar28 = uVar28 + 1;
      } while (__n != uVar28);
    }
  }
  return;
}

Assistant:

void compress_color_block(uint n, const color_quad_u8* block, uint& low16, uint& high16, uint8* pSelectors, bool refine) {
  CRNLIB_ASSERT((n & 15) == 0);

  uint ave_color[3];
  float axis[3];

  if (!optimize_block_colors(n, block, low16, high16, ave_color, axis)) {
    compress_solid_block(n, ave_color, low16, high16, pSelectors);
  } else {
    if (!determine_selectors(n, block, low16, high16, pSelectors))
      compress_solid_block(n, ave_color, low16, high16, pSelectors);
    else {
      if (refine_block(n, block, low16, high16, pSelectors))
        determine_selectors(n, block, low16, high16, pSelectors);

      if (refine)
        refine_endpoints2(n, block, low16, high16, pSelectors, axis);
    }
  }

  if (low16 < high16) {
    utils::swap(low16, high16);
    for (uint i = 0; i < n; i++)
      pSelectors[i] ^= 1;
  }
}